

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

void vector_insert(vector v,size_t position,void *element)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __n;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  
  if (v == (vector)0x0) {
    return;
  }
  if ((v->size == v->capacity) && (iVar1 = vector_reserve(v,v->size * 2), iVar1 != 0)) {
    log_write_impl_va("metacall",0x1a5,"vector_insert",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                      ,3);
  }
  __n = v->type_size;
  uVar3 = v->size;
  pvVar4 = v->data;
  if (uVar3 < position || uVar3 - position == 0) {
    if (pvVar4 != (void *)0x0) {
      uVar3 = uVar3 * __n;
      uVar2 = v->capacity * __n;
      pvVar5 = (void *)0x0;
      if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
        pvVar5 = (void *)((long)pvVar4 + uVar3);
      }
      goto LAB_00105315;
    }
  }
  else {
    if (pvVar4 == (void *)0x0) {
      pvVar5 = (void *)0x0;
      pvVar4 = (void *)0x0;
    }
    else {
      uVar2 = (position + 1) * __n;
      uVar6 = v->capacity * __n;
      pvVar5 = (void *)((long)pvVar4 + uVar2);
      if (uVar6 < uVar2 || uVar6 - uVar2 == 0) {
        pvVar5 = (void *)0x0;
      }
      uVar2 = __n * position;
      pvVar4 = (void *)((long)pvVar4 + uVar2);
      if (uVar6 < uVar2 || uVar6 - uVar2 == 0) {
        pvVar4 = (void *)0x0;
      }
    }
    memmove(pvVar5,pvVar4,__n * (uVar3 - position));
    __n = v->type_size;
    if (v->data != (void *)0x0) {
      uVar2 = position * __n;
      uVar3 = v->capacity * __n;
      pvVar5 = (void *)0x0;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        pvVar5 = (void *)((long)v->data + uVar2);
      }
      goto LAB_00105315;
    }
  }
  pvVar5 = (void *)0x0;
LAB_00105315:
  memcpy(pvVar5,element,__n);
  v->size = v->size + 1;
  return;
}

Assistant:

void vector_insert(vector v, size_t position, void *element)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		if (position < v->size)
		{
			memmove(vector_data_offset_bytes(v, (position + 1) * v->type_size),
				vector_data_offset_bytes(v, position * v->type_size),
				(v->size - position) * v->type_size);

			memcpy(vector_data_offset_bytes(v, position * v->type_size), element, v->type_size);
		}
		else
		{
			memcpy(vector_data_offset_bytes(v, v->size * v->type_size), element, v->type_size);
		}

		++v->size;
	}
}